

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Bmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Gia_Man_t *pGia;
  Bmc_AndPar_t Pars;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  ulong local_80;
  Bmc_AndPar_t local_78;
  Abc_Frame_t *local_38;
  
  local_78.nFramesAdd = 0;
  local_78.nStart = 0;
  local_78.nFramesMax = 0;
  local_78.fLoadCnf = 0;
  local_80 = 0;
  local_78.nConfLimit = 0;
  local_78.nTimeOut = 0;
  local_78.fNotVerbose = 0;
  local_78.iFrame = 0;
  local_78.nFailOuts = 0;
  local_78.nDropOuts = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  local_84 = 1;
  local_98 = 0x32;
  local_a0 = 0;
  local_9c = 0;
  local_94 = 0;
  local_90 = 0;
  local_8c = 0;
  local_88 = 0;
  uVar3 = local_78.nStart;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"SFATdscvwh"), pAbc_00 = local_38,
            iVar4 = globalUtilOptind, 0x62 < iVar1) {
        if (iVar1 < 0x73) {
          if (iVar1 == 99) {
            local_84 = local_84 ^ 1;
          }
          else {
            if (iVar1 != 100) goto LAB_0022ff4c;
            local_94 = local_94 ^ 1;
          }
        }
        else if (iVar1 == 0x73) {
          local_90 = local_90 ^ 1;
        }
        else if (iVar1 == 0x76) {
          local_8c = local_8c ^ 1;
        }
        else {
          if (iVar1 != 0x77) goto LAB_0022ff4c;
          local_88 = local_88 ^ 1;
        }
      }
      if (0x52 < iVar1) break;
      if (iVar1 == 0x41) {
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-A\" should be followed by an integer.\n";
          goto LAB_0022ff89;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98 = uVar2;
      }
      else {
        if (iVar1 != 0x46) {
          if (iVar1 == -1) {
            local_78.fVeryVerbose = local_88;
            local_78.fVerbose = local_8c;
            local_78.fUseOldCnf = local_84;
            local_78.fUseSynth = local_90;
            local_78.fDumpFrames = local_94;
            local_78.nTimeOut = local_9c;
            local_78.nFramesAdd = local_98;
            local_78.nFramesMax = local_a0;
            local_78.nStart = uVar3;
            pGia = local_38->pGia;
            if (pGia == (Gia_Man_t *)0x0) {
              pcVar5 = "Abc_CommandAbc9Bmc(): There is no AIG.\n";
LAB_002300f3:
              Abc_Print(-1,pcVar5);
              return 0;
            }
            if (local_84 == 0) {
              iVar4 = Sdm_ManCanRead();
              if (iVar4 == 0) {
                pcVar5 = "Abc_CommandAbc9Bmc(): Cannot input precomputed DSD information.\n";
                goto LAB_002300f3;
              }
              pGia = pAbc_00->pGia;
            }
            iVar4 = Gia_ManBmcPerform(pGia,&local_78);
            pAbc_00->Status = iVar4;
            pAbc_00->nFrames = local_78.iFrame;
            Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
            return 0;
          }
          goto LAB_0022ff4c;
        }
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_0022ff89;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_a0 = uVar2;
      }
LAB_0022fe73:
      globalUtilOptind = iVar4 + 1;
      if ((int)uVar2 < 0) goto LAB_0022ff4c;
    }
    if (iVar1 != 0x53) {
      if (iVar1 == 0x54) {
        if (globalUtilOptind < argc) {
          uVar2 = atoi(argv[globalUtilOptind]);
          local_9c = uVar2;
          goto LAB_0022fe73;
        }
        pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_0022ff89:
        local_78.nStart = uVar3;
        Abc_Print(-1,pcVar5);
        goto LAB_0022ff95;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
      goto LAB_0022ff89;
    }
    uVar3 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    local_80 = (ulong)uVar3;
  } while (-1 < (int)uVar3);
LAB_0022ff4c:
  local_78.nStart = uVar3;
LAB_0022ff95:
  Abc_Print(-2,"usage: &bmc [-SFAT num] [-dscvwh]\n");
  Abc_Print(-2,"\t         performs bounded model checking\n");
  Abc_Print(-2,"\t-S num : the starting timeframe [default = %d]\n",local_80);
  Abc_Print(-2,"\t-F num : the maximum number of timeframes [default = %d]\n",(ulong)local_a0);
  Abc_Print(-2,"\t-A num : the number of additional frames to unroll [default = %d]\n",
            (ulong)local_98);
  Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",(ulong)local_9c);
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (local_94 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle dumping unfolded timeframes [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_90 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle synthesizing unrolled timeframes [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_84 == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle using old CNF computation [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_8c == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  if (local_88 == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-w     : toggle printing information about unfolding [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Bmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Bmc_AndPar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_AndPar_t) );
    pPars->nStart        =    0;  // starting timeframe
    pPars->nFramesMax    =    0;  // maximum number of timeframes 
    pPars->nFramesAdd    =   50;  // the number of additional frames
    pPars->nConfLimit    =    0;  // maximum number of conflicts at a node
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->fLoadCnf      =    0;  // dynamic CNF loading
    pPars->fDumpFrames   =    0;  // dump unrolled timeframes
    pPars->fUseSynth     =    0;  // use synthesis
    pPars->fUseOldCnf    =    1;  // use old CNF construction
    pPars->fVerbose      =    0;  // verbose 
    pPars->fVeryVerbose  =    0;  // very verbose 
    pPars->fNotVerbose   =    0;  // skip line-by-line print-out 
    pPars->iFrame        =    0;  // explored up to this frame
    pPars->nFailOuts     =    0;  // the number of failed outputs
    pPars->nDropOuts     =    0;  // the number of dropped outputs
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SFATdscvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesAdd < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fDumpFrames ^= 1;
            break;
        case 's':
            pPars->fUseSynth ^= 1;
            break;
        case 'c':
            pPars->fUseOldCnf ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmc(): There is no AIG.\n" );
        return 0;
    }
    if ( !pPars->fUseOldCnf && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "Abc_CommandAbc9Bmc(): Cannot input precomputed DSD information.\n" );
        return 0;
    }
    pAbc->Status  = Gia_ManBmcPerform( pAbc->pGia, pPars );
    pAbc->nFrames = pPars->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &bmc [-SFAT num] [-dscvwh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking\n" );
    Abc_Print( -2, "\t-S num : the starting timeframe [default = %d]\n",                      pPars->nStart );
    Abc_Print( -2, "\t-F num : the maximum number of timeframes [default = %d]\n",            pPars->nFramesMax );
    Abc_Print( -2, "\t-A num : the number of additional frames to unroll [default = %d]\n",   pPars->nFramesAdd );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-d     : toggle dumping unfolded timeframes [default = %s]\n",          pPars->fDumpFrames?  "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle synthesizing unrolled timeframes [default = %s]\n",     pPars->fUseSynth?    "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using old CNF computation [default = %s]\n",            pPars->fUseOldCnf?   "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing information about unfolding [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}